

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax.cpp
# Opt level: O1

int __thiscall ncnn::Softmax::forward_inplace(Softmax *this,Mat *bottom_top_blob,Option *opt)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  Mat *pMVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  void *pvVar10;
  ulong uVar11;
  undefined1 auVar12 [8];
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  void *pvVar17;
  void *pvVar18;
  int iVar19;
  void *pvVar20;
  void *pvVar21;
  int iVar22;
  ulong uVar23;
  size_t sVar24;
  float fVar25;
  float fVar26;
  int iVar29;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  Mat max;
  Mat sum;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  size_t local_b8;
  Mat *local_b0;
  undefined1 local_a8 [8];
  int *piStack_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  size_t local_78;
  void *local_70;
  size_t local_68;
  void *local_60;
  Option *local_58;
  void *local_50;
  long local_48;
  long local_40;
  void *local_38;
  
  uVar7 = bottom_top_blob->dims;
  if (uVar7 == 1) {
    iVar29 = bottom_top_blob->w;
    lVar13 = (long)iVar29;
    pvVar10 = bottom_top_blob->data;
    fVar26 = -3.4028235e+38;
    if (0 < lVar13) {
      lVar9 = 0;
      do {
        fVar25 = *(float *)((long)pvVar10 + lVar9 * 4);
        if (fVar26 <= fVar25) {
          fVar26 = fVar25;
        }
        lVar9 = lVar9 + 1;
      } while (lVar13 != lVar9);
    }
    if (0 < iVar29) {
      lVar9 = 0;
      do {
        fVar25 = expf(*(float *)((long)pvVar10 + lVar9 * 4) - fVar26);
        *(float *)((long)pvVar10 + lVar9 * 4) = fVar25;
        lVar9 = lVar9 + 1;
      } while (lVar13 != lVar9);
    }
    fVar26 = 0.0;
    if (0 < iVar29) {
      lVar9 = 0;
      do {
        fVar26 = fVar26 + *(float *)((long)pvVar10 + lVar9 * 4);
        lVar9 = lVar9 + 1;
      } while (lVar13 != lVar9);
    }
    if (0 < iVar29) {
      lVar9 = 0;
      do {
        *(float *)((long)pvVar10 + lVar9 * 4) =
             *(float *)((long)pvVar10 + lVar9 * 4) * (1.0 / fVar26);
        lVar9 = lVar9 + 1;
      } while (lVar13 != lVar9);
      return 0;
    }
LAB_0011d45a:
    iVar22 = 0;
  }
  else {
    local_68 = bottom_top_blob->elemsize;
    uVar16 = this->axis;
    local_b0 = bottom_top_blob;
    local_58 = opt;
    if ((uVar7 ^ 2) == 0 && uVar16 == 0) {
      uVar7 = bottom_top_blob->w;
      uVar11 = (ulong)uVar7;
      uVar16 = bottom_top_blob->h;
      uVar14 = (ulong)uVar16;
      sVar24 = (size_t)(int)uVar7;
      local_d8._8_8_ = opt->workspace_allocator;
      local_e8 = (undefined1  [16])0x0;
      local_d8._0_8_ = local_68;
      local_c8._4_4_ = uVar7;
      local_c8._0_4_ = 1;
      local_c8._8_8_ = 0x100000001;
      local_b8 = sVar24;
      if (uVar7 != 0) {
        uVar23 = local_68 * sVar24 + 3 & 0xfffffffffffffffc;
        if ((Allocator *)local_d8._8_8_ == (Allocator *)0x0) {
          pvVar10 = malloc(uVar23 + 0x1c);
          local_e8._0_8_ = (long)pvVar10 + 0x17U & 0xfffffffffffffff0;
          *(void **)(local_e8._0_8_ - 8) = pvVar10;
        }
        else {
          local_e8._0_8_ = (*(code *)**(undefined8 **)local_d8._8_8_)(local_d8._8_8_);
        }
        local_e8._8_8_ = local_e8._0_8_ + uVar23;
        *(undefined4 *)(local_e8._0_8_ + uVar23) = 1;
      }
      auVar31 = _DAT_001394c0;
      auVar3 = _DAT_001394b0;
      auVar30 = _DAT_00139440;
      uVar5 = local_e8._0_8_;
      iVar22 = -100;
      if (((void *)local_e8._0_8_ != (void *)0x0) && ((long)(int)local_c8._12_4_ * local_b8 != 0)) {
        uVar8 = local_c8._12_4_ * (int)local_b8;
        if (0 < (int)uVar8) {
          lVar13 = (ulong)uVar8 - 1;
          auVar27._8_4_ = (int)lVar13;
          auVar27._0_8_ = lVar13;
          auVar27._12_4_ = (int)((ulong)lVar13 >> 0x20);
          uVar23 = 0;
          auVar27 = auVar27 ^ _DAT_00139440;
          do {
            auVar33._8_4_ = (int)uVar23;
            auVar33._0_8_ = uVar23;
            auVar33._12_4_ = (int)(uVar23 >> 0x20);
            auVar36 = (auVar33 | auVar31) ^ auVar30;
            iVar29 = auVar27._4_4_;
            if ((bool)(~(auVar36._4_4_ == iVar29 && auVar27._0_4_ < auVar36._0_4_ ||
                        iVar29 < auVar36._4_4_) & 1)) {
              *(undefined4 *)(local_e8._0_8_ + uVar23 * 4) = 0xff7fffff;
            }
            if ((auVar36._12_4_ != auVar27._12_4_ || auVar36._8_4_ <= auVar27._8_4_) &&
                auVar36._12_4_ <= auVar27._12_4_) {
              *(undefined4 *)(local_e8._0_8_ + uVar23 * 4 + 4) = 0xff7fffff;
            }
            auVar36 = (auVar33 | auVar3) ^ auVar30;
            iVar19 = auVar36._4_4_;
            if (iVar19 <= iVar29 && (iVar19 != iVar29 || auVar36._0_4_ <= auVar27._0_4_)) {
              *(undefined4 *)(local_e8._0_8_ + uVar23 * 4 + 8) = 0xff7fffff;
              *(undefined4 *)(local_e8._0_8_ + uVar23 * 4 + 0xc) = 0xff7fffff;
            }
            uVar23 = uVar23 + 4;
          } while ((uVar8 + 3 & 0xfffffffc) != uVar23);
        }
        if (0 < (int)uVar16) {
          pvVar10 = local_b0->data;
          iVar29 = local_b0->w;
          uVar23 = 0;
          do {
            if (0 < (int)uVar7) {
              uVar15 = 0;
              do {
                fVar25 = *(float *)((long)pvVar10 + uVar15 * 4);
                fVar26 = *(float *)(local_e8._0_8_ + uVar15 * 4);
                if (fVar25 <= fVar26) {
                  fVar25 = fVar26;
                }
                *(float *)(local_e8._0_8_ + uVar15 * 4) = fVar25;
                uVar15 = uVar15 + 1;
              } while (uVar11 != uVar15);
            }
            uVar23 = uVar23 + 1;
            pvVar10 = (void *)((long)pvVar10 + (long)iVar29 * 4);
          } while (uVar23 != uVar14);
        }
        if (0 < (int)uVar16) {
          pvVar10 = local_b0->data;
          iVar29 = local_b0->w;
          uVar23 = 0;
          do {
            if (0 < (int)uVar7) {
              uVar15 = 0;
              do {
                fVar26 = expf(*(float *)((long)pvVar10 + uVar15 * 4) -
                              *(float *)(uVar5 + uVar15 * 4));
                *(float *)((long)pvVar10 + uVar15 * 4) = fVar26;
                uVar15 = uVar15 + 1;
              } while (uVar11 != uVar15);
            }
            uVar23 = uVar23 + 1;
            pvVar10 = (void *)((long)pvVar10 + (long)iVar29 * 4);
          } while (uVar23 != uVar14);
        }
        local_98._8_8_ = local_58->workspace_allocator;
        _local_a8 = (undefined1  [16])0x0;
        local_98._0_8_ = local_68;
        local_88._4_4_ = uVar7;
        local_88._0_4_ = 1;
        local_88._8_8_ = 0x100000001;
        local_78 = sVar24;
        if (uVar7 != 0) {
          uVar23 = local_68 * sVar24 + 3 & 0xfffffffffffffffc;
          if ((Allocator *)local_98._8_8_ == (Allocator *)0x0) {
            pvVar10 = malloc(uVar23 + 0x1c);
            local_a8 = (undefined1  [8])((long)pvVar10 + 0x17U & 0xfffffffffffffff0);
            *(void **)((long)local_a8 - 8) = pvVar10;
          }
          else {
            local_a8 = (undefined1  [8])(*(code *)**(undefined8 **)local_98._8_8_)(local_98._8_8_);
          }
          piStack_a0 = (int *)((long)local_a8 + uVar23);
          *(undefined4 *)((long)local_a8 + uVar23) = 1;
        }
        auVar12 = local_a8;
        iVar22 = -100;
        if ((local_a8 != (undefined1  [8])0x0) && ((long)(int)local_88._12_4_ * local_78 != 0)) {
          if (0 < local_88._12_4_ * (int)local_78) {
            memset((void *)local_a8,0,(ulong)(uint)(local_88._12_4_ * (int)local_78) << 2);
          }
          if (0 < (int)uVar16) {
            pvVar10 = local_b0->data;
            iVar29 = local_b0->w;
            uVar23 = 0;
            do {
              if (0 < (int)uVar7) {
                uVar15 = 0;
                do {
                  *(float *)((long)auVar12 + uVar15 * 4) =
                       *(float *)((long)auVar12 + uVar15 * 4) +
                       *(float *)((long)pvVar10 + uVar15 * 4);
                  uVar15 = uVar15 + 1;
                } while (uVar11 != uVar15);
              }
              uVar23 = uVar23 + 1;
              pvVar10 = (void *)((long)pvVar10 + (long)iVar29 * 4);
            } while (uVar23 != uVar14);
          }
          if (0 < (int)uVar16) {
            pvVar10 = local_b0->data;
            iVar29 = local_b0->w;
            uVar23 = 0;
            do {
              if (0 < (int)uVar7) {
                uVar15 = 0;
                do {
                  *(float *)((long)pvVar10 + uVar15 * 4) =
                       *(float *)((long)pvVar10 + uVar15 * 4) /
                       *(float *)((long)auVar12 + uVar15 * 4);
                  uVar15 = uVar15 + 1;
                } while (uVar11 != uVar15);
              }
              uVar23 = uVar23 + 1;
              pvVar10 = (void *)((long)pvVar10 + (long)iVar29 * 4);
            } while (uVar23 != uVar14);
          }
          iVar22 = 0;
        }
        if (piStack_a0 != (int *)0x0) {
          LOCK();
          *piStack_a0 = *piStack_a0 + -1;
          UNLOCK();
          if (*piStack_a0 == 0) {
            if ((Allocator *)local_98._8_8_ == (Allocator *)0x0) {
              if (local_a8 != (undefined1  [8])0x0) {
                free(*(void **)((long)local_a8 + -8));
              }
            }
            else {
              (**(code **)(*(long *)local_98._8_8_ + 8))();
            }
          }
        }
        _local_a8 = (undefined1  [16])0x0;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = local_98._8_8_;
        local_98 = auVar2 << 0x40;
        local_78 = 0;
        local_88 = (undefined1  [16])0x0;
      }
      if ((int *)local_e8._8_8_ == (int *)0x0) {
        return iVar22;
      }
      LOCK();
      *(int *)local_e8._8_8_ = *(int *)local_e8._8_8_ + -1;
      UNLOCK();
      if (*(int *)local_e8._8_8_ != 0) {
        return iVar22;
      }
      if ((Allocator *)local_d8._8_8_ != (Allocator *)0x0) {
        (**(code **)(*(long *)local_d8._8_8_ + 8))();
        return iVar22;
      }
    }
    else {
      if ((uVar7 ^ 2) == 0 && (uVar16 ^ 1) == 0) {
        uVar7 = bottom_top_blob->w;
        uVar14 = (ulong)uVar7;
        uVar16 = bottom_top_blob->h;
        uVar11 = (ulong)uVar16;
        sVar24 = (size_t)(int)uVar16;
        local_d8._8_8_ = opt->workspace_allocator;
        local_e8 = ZEXT816(0);
        local_d8._0_8_ = local_68;
        local_c8._4_4_ = uVar16;
        local_c8._0_4_ = 1;
        local_c8._8_8_ = 0x100000001;
        local_b8 = sVar24;
        if (uVar16 != 0) {
          uVar23 = local_68 * sVar24 + 3 & 0xfffffffffffffffc;
          if ((Allocator *)local_d8._8_8_ == (Allocator *)0x0) {
            pvVar10 = malloc(uVar23 + 0x1c);
            local_e8._0_8_ = (long)pvVar10 + 0x17U & 0xfffffffffffffff0;
            *(void **)(local_e8._0_8_ - 8) = pvVar10;
          }
          else {
            local_e8._0_8_ = (*(code *)**(undefined8 **)local_d8._8_8_)();
          }
          local_e8._8_8_ = local_e8._0_8_ + uVar23;
          *(undefined4 *)(local_e8._0_8_ + uVar23) = 1;
        }
        uVar5 = local_e8._0_8_;
        iVar29 = -100;
        if (((void *)local_e8._0_8_ != (void *)0x0) && ((long)(int)local_c8._12_4_ * local_b8 != 0))
        {
          if (0 < (int)uVar16) {
            pvVar10 = local_b0->data;
            iVar29 = local_b0->w;
            uVar23 = 0;
            do {
              auVar30 = ZEXT816(0xff7fffff);
              if (0 < (int)uVar7) {
                uVar15 = 0;
                auVar30 = ZEXT816(0xff7fffff);
                do {
                  fVar26 = *(float *)((long)pvVar10 + uVar15 * 4);
                  if (auVar30._0_4_ <= fVar26) {
                    auVar30._0_4_ = fVar26;
                  }
                  uVar15 = uVar15 + 1;
                } while (uVar14 != uVar15);
              }
              *(int *)(local_e8._0_8_ + uVar23 * 4) = auVar30._0_4_;
              uVar23 = uVar23 + 1;
              pvVar10 = (void *)((long)pvVar10 + (long)iVar29 * 4);
            } while (uVar23 != uVar11);
          }
          if (0 < (int)uVar16) {
            pvVar10 = local_b0->data;
            iVar29 = local_b0->w;
            uVar23 = 0;
            do {
              if (0 < (int)uVar7) {
                fVar26 = *(float *)(uVar5 + uVar23 * 4);
                uVar15 = 0;
                do {
                  fVar25 = expf(*(float *)((long)pvVar10 + uVar15 * 4) - fVar26);
                  *(float *)((long)pvVar10 + uVar15 * 4) = fVar25;
                  uVar15 = uVar15 + 1;
                } while (uVar14 != uVar15);
              }
              uVar23 = uVar23 + 1;
              pvVar10 = (void *)((long)pvVar10 + (long)iVar29 * 4);
            } while (uVar23 != uVar11);
          }
          local_98._8_8_ = local_58->workspace_allocator;
          local_a8 = (undefined1  [8])0x0;
          piStack_a0 = (int *)0x0;
          local_98._0_8_ = local_68;
          local_88._4_4_ = uVar16;
          local_88._0_4_ = 1;
          local_88._8_8_ = 0x100000001;
          local_78 = sVar24;
          if (uVar16 != 0) {
            uVar23 = local_68 * sVar24 + 3 & 0xfffffffffffffffc;
            if ((Allocator *)local_98._8_8_ == (Allocator *)0x0) {
              pvVar10 = malloc(uVar23 + 0x1c);
              local_a8 = (undefined1  [8])((long)pvVar10 + 0x17U & 0xfffffffffffffff0);
              *(void **)((long)local_a8 - 8) = pvVar10;
            }
            else {
              local_a8 = (undefined1  [8])(*(code *)**(undefined8 **)local_98._8_8_)();
            }
            piStack_a0 = (int *)((long)local_a8 + uVar23);
            *(undefined4 *)((long)local_a8 + uVar23) = 1;
          }
          iVar29 = -100;
          if ((local_a8 != (undefined1  [8])0x0) && ((long)(int)local_88._12_4_ * local_78 != 0)) {
            if (0 < (int)uVar16) {
              pvVar10 = local_b0->data;
              iVar29 = local_b0->w;
              uVar23 = 0;
              do {
                fVar26 = 0.0;
                if (0 < (int)uVar7) {
                  uVar15 = 0;
                  do {
                    fVar26 = fVar26 + *(float *)((long)pvVar10 + uVar15 * 4);
                    uVar15 = uVar15 + 1;
                  } while (uVar14 != uVar15);
                }
                *(float *)((long)local_a8 + uVar23 * 4) = fVar26;
                uVar23 = uVar23 + 1;
                pvVar10 = (void *)((long)pvVar10 + (long)iVar29 * 4);
              } while (uVar23 != uVar11);
            }
            if (0 < (int)uVar16) {
              pvVar10 = local_b0->data;
              iVar29 = local_b0->w;
              uVar23 = 0;
              do {
                if (0 < (int)uVar7) {
                  fVar26 = *(float *)((long)local_a8 + uVar23 * 4);
                  uVar15 = 0;
                  do {
                    *(float *)((long)pvVar10 + uVar15 * 4) =
                         *(float *)((long)pvVar10 + uVar15 * 4) * (1.0 / fVar26);
                    uVar15 = uVar15 + 1;
                  } while (uVar14 != uVar15);
                }
                uVar23 = uVar23 + 1;
                pvVar10 = (void *)((long)pvVar10 + (long)iVar29 * 4);
              } while (uVar23 != uVar11);
            }
            iVar29 = 0;
          }
          if (piStack_a0 != (int *)0x0) {
            LOCK();
            *piStack_a0 = *piStack_a0 + -1;
            UNLOCK();
            if (*piStack_a0 == 0) {
              if ((Allocator *)local_98._8_8_ == (Allocator *)0x0) {
                if (local_a8 != (undefined1  [8])0x0) {
                  free(*(void **)((long)local_a8 - 8));
                }
              }
              else {
                (**(code **)(*(long *)local_98._8_8_ + 8))();
              }
            }
          }
          _local_a8 = ZEXT816(0);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = local_98._8_8_;
          local_98 = auVar3 << 0x40;
          local_78 = 0;
          local_88 = ZEXT816(0);
        }
        if ((int *)local_e8._8_8_ == (int *)0x0) {
          return iVar29;
        }
        LOCK();
        *(int *)local_e8._8_8_ = *(int *)local_e8._8_8_ + -1;
        UNLOCK();
        if (*(int *)local_e8._8_8_ != 0) {
          return iVar29;
        }
        if ((Allocator *)local_d8._8_8_ != (Allocator *)0x0) {
          (**(code **)(*(long *)local_d8._8_8_ + 8))();
          return iVar29;
        }
        if ((void *)local_e8._0_8_ == (void *)0x0) {
          return iVar29;
        }
        free(*(void **)(local_e8._0_8_ + -8));
        return iVar29;
      }
      uVar7 = uVar7 ^ 3;
      if (uVar7 != 0 || uVar16 != 0) {
        if ((uVar16 ^ 1) == 0 && uVar7 == 0) {
          uVar7 = bottom_top_blob->w;
          uVar11 = (ulong)uVar7;
          uVar16 = bottom_top_blob->h;
          uVar14 = (ulong)uVar16;
          local_c8._8_4_ = bottom_top_blob->c;
          local_60 = (void *)(ulong)(uint)local_c8._8_4_;
          local_d8._8_8_ = opt->workspace_allocator;
          local_e8 = (undefined1  [16])0x0;
          local_d8._0_8_ = local_68;
          local_c8._4_4_ = uVar16;
          local_c8._0_4_ = 2;
          local_c8._12_4_ = 1;
          local_b8 = (size_t)(int)(local_c8._8_4_ * uVar16);
          if (local_c8._8_4_ * uVar16 != 0) {
            uVar23 = local_b8 * local_68 + 3 & 0xfffffffffffffffc;
            if ((Allocator *)local_d8._8_8_ == (Allocator *)0x0) {
              pvVar10 = malloc(uVar23 + 0x1c);
              local_e8._0_8_ = (long)pvVar10 + 0x17U & 0xfffffffffffffff0;
              *(void **)(local_e8._0_8_ - 8) = pvVar10;
            }
            else {
              local_e8._0_8_ = (*(code *)**(undefined8 **)local_d8._8_8_)(local_d8._8_8_,uVar23 + 4)
              ;
            }
            local_e8._8_8_ = local_e8._0_8_ + uVar23;
            *(undefined4 *)(local_e8._0_8_ + uVar23) = 1;
          }
          auVar31 = _DAT_001394c0;
          auVar3 = _DAT_001394b0;
          auVar30 = _DAT_00139440;
          iVar29 = -100;
          if (((void *)local_e8._0_8_ != (void *)0x0) &&
             ((long)(int)local_c8._12_4_ * local_b8 != 0)) {
            uVar8 = local_c8._12_4_ * (int)local_b8;
            if (0 < (int)uVar8) {
              lVar13 = (ulong)uVar8 - 1;
              auVar36._8_4_ = (int)lVar13;
              auVar36._0_8_ = lVar13;
              auVar36._12_4_ = (int)((ulong)lVar13 >> 0x20);
              uVar23 = 0;
              auVar36 = auVar36 ^ _DAT_00139440;
              do {
                auVar35._8_4_ = (int)uVar23;
                auVar35._0_8_ = uVar23;
                auVar35._12_4_ = (int)(uVar23 >> 0x20);
                auVar37 = (auVar35 | auVar31) ^ auVar30;
                iVar29 = auVar36._4_4_;
                if ((bool)(~(auVar37._4_4_ == iVar29 && auVar36._0_4_ < auVar37._0_4_ ||
                            iVar29 < auVar37._4_4_) & 1)) {
                  *(undefined4 *)(local_e8._0_8_ + uVar23 * 4) = 0xff7fffff;
                }
                if ((auVar37._12_4_ != auVar36._12_4_ || auVar37._8_4_ <= auVar36._8_4_) &&
                    auVar37._12_4_ <= auVar36._12_4_) {
                  *(undefined4 *)(local_e8._0_8_ + uVar23 * 4 + 4) = 0xff7fffff;
                }
                auVar35 = (auVar35 | auVar3) ^ auVar30;
                iVar19 = auVar35._4_4_;
                if (iVar19 <= iVar29 && (iVar19 != iVar29 || auVar35._0_4_ <= auVar36._0_4_)) {
                  *(undefined4 *)(local_e8._0_8_ + uVar23 * 4 + 8) = 0xff7fffff;
                  *(undefined4 *)(local_e8._0_8_ + uVar23 * 4 + 0xc) = 0xff7fffff;
                }
                uVar23 = uVar23 + 4;
              } while ((uVar8 + 3 & 0xfffffffc) != uVar23);
            }
            lVar13 = (long)(int)uVar7;
            if (0 < (int)local_60) {
              pvVar10 = local_b0->data;
              sVar24 = local_b0->cstep;
              sVar1 = local_b0->elemsize;
              pvVar18 = (void *)0x0;
              do {
                if (0 < (int)uVar16) {
                  uVar23 = 0;
                  pvVar21 = pvVar10;
                  do {
                    auVar31 = ZEXT816(0xff7fffff);
                    if (0 < (int)uVar7) {
                      uVar15 = 0;
                      auVar31 = ZEXT816(0xff7fffff);
                      do {
                        fVar26 = *(float *)((long)pvVar21 + uVar15 * 4);
                        if (auVar31._0_4_ <= fVar26) {
                          auVar31._0_4_ = fVar26;
                        }
                        uVar15 = uVar15 + 1;
                      } while (uVar11 != uVar15);
                    }
                    *(int *)(local_e8._0_8_ +
                            uVar23 * 4 + (long)pvVar18 * (long)(int)local_c8._4_4_ * 4) =
                         auVar31._0_4_;
                    uVar23 = uVar23 + 1;
                    pvVar21 = (void *)((long)pvVar21 + lVar13 * 4);
                  } while (uVar23 != uVar14);
                }
                pvVar18 = (void *)((long)pvVar18 + 1);
                pvVar10 = (void *)((long)pvVar10 + sVar24 * sVar1);
              } while (pvVar18 != local_60);
            }
            if (0 < (int)local_60) {
              local_50 = local_b0->data;
              local_38 = (void *)local_e8._0_8_;
              local_40 = (long)(int)local_c8._4_4_;
              local_48 = local_b0->cstep * local_b0->elemsize;
              local_70 = (void *)0x0;
              do {
                pvVar10 = local_38;
                if (0 < (int)uVar16) {
                  lVar9 = (long)local_70 * local_40;
                  uVar23 = 0;
                  pvVar18 = local_50;
                  do {
                    if (0 < (int)uVar7) {
                      fVar26 = *(float *)((long)pvVar10 + uVar23 * 4 + lVar9 * 4);
                      uVar15 = 0;
                      do {
                        fVar25 = expf(*(float *)((long)pvVar18 + uVar15 * 4) - fVar26);
                        *(float *)((long)pvVar18 + uVar15 * 4) = fVar25;
                        uVar15 = uVar15 + 1;
                      } while (uVar11 != uVar15);
                    }
                    uVar23 = uVar23 + 1;
                    pvVar18 = (void *)((long)pvVar18 + lVar13 * 4);
                  } while (uVar23 != uVar14);
                }
                local_70 = (void *)((long)local_70 + 1);
                local_50 = (void *)((long)local_50 + local_48);
              } while (local_70 != local_60);
            }
            local_88 = (undefined1  [16])0x0;
            local_98 = (undefined1  [16])0x0;
            _local_a8 = (undefined1  [16])0x0;
            local_78 = 0;
            Mat::create((Mat *)local_a8,uVar16,(int)local_60,local_68,local_58->workspace_allocator)
            ;
            iVar29 = -100;
            if ((local_a8 != (undefined1  [8])0x0) && ((long)(int)local_88._12_4_ * local_78 != 0))
            {
              if (0 < local_88._12_4_ * (int)local_78) {
                memset((void *)local_a8,0,(ulong)(uint)(local_88._12_4_ * (int)local_78) << 2);
              }
              if (0 < (int)local_60) {
                pvVar10 = local_b0->data;
                sVar24 = local_b0->cstep;
                sVar1 = local_b0->elemsize;
                pvVar18 = (void *)0x0;
                do {
                  if (0 < (int)uVar16) {
                    uVar23 = 0;
                    pvVar21 = pvVar10;
                    do {
                      fVar26 = 0.0;
                      if (0 < (int)uVar7) {
                        uVar15 = 0;
                        do {
                          fVar26 = fVar26 + *(float *)((long)pvVar21 + uVar15 * 4);
                          uVar15 = uVar15 + 1;
                        } while (uVar11 != uVar15);
                      }
                      *(float *)((long)local_a8 +
                                uVar23 * 4 + (long)pvVar18 * (long)(int)local_88._4_4_ * 4) = fVar26
                      ;
                      uVar23 = uVar23 + 1;
                      pvVar21 = (void *)((long)pvVar21 + lVar13 * 4);
                    } while (uVar23 != uVar14);
                  }
                  pvVar18 = (void *)((long)pvVar18 + 1);
                  pvVar10 = (void *)((long)pvVar10 + sVar24 * sVar1);
                } while (pvVar18 != local_60);
              }
              if (0 < (int)local_60) {
                pvVar10 = local_b0->data;
                sVar24 = local_b0->cstep;
                sVar1 = local_b0->elemsize;
                pvVar18 = (void *)0x0;
                do {
                  if (0 < (int)uVar16) {
                    uVar23 = 0;
                    pvVar21 = pvVar10;
                    do {
                      if (0 < (int)uVar7) {
                        fVar26 = *(float *)((long)local_a8 +
                                           uVar23 * 4 +
                                           (long)pvVar18 * (long)(int)local_88._4_4_ * 4);
                        uVar15 = 0;
                        do {
                          *(float *)((long)pvVar21 + uVar15 * 4) =
                               *(float *)((long)pvVar21 + uVar15 * 4) * (1.0 / fVar26);
                          uVar15 = uVar15 + 1;
                        } while (uVar11 != uVar15);
                      }
                      uVar23 = uVar23 + 1;
                      pvVar21 = (void *)((long)pvVar21 + lVar13 * 4);
                    } while (uVar23 != uVar14);
                  }
                  pvVar18 = (void *)((long)pvVar18 + 1);
                  pvVar10 = (void *)((long)pvVar10 + sVar24 * sVar1);
                } while (pvVar18 != local_60);
              }
              iVar29 = 0;
            }
            Mat::~Mat((Mat *)local_a8);
          }
          if ((int *)local_e8._8_8_ == (int *)0x0) {
            return iVar29;
          }
          LOCK();
          *(int *)local_e8._8_8_ = *(int *)local_e8._8_8_ + -1;
          UNLOCK();
          if (*(int *)local_e8._8_8_ != 0) {
            return iVar29;
          }
          if ((Allocator *)local_d8._8_8_ != (Allocator *)0x0) {
            (**(code **)(*(long *)local_d8._8_8_ + 8))();
            return iVar29;
          }
          if ((void *)local_e8._0_8_ == (void *)0x0) {
            return iVar29;
          }
          free(*(void **)(local_e8._0_8_ + -8));
          return iVar29;
        }
        if (uVar7 == 0 && uVar16 == 2) {
          uVar7 = bottom_top_blob->w;
          uVar14 = (ulong)uVar7;
          iVar29 = bottom_top_blob->h;
          uVar16 = bottom_top_blob->c;
          pvVar10 = (void *)(ulong)uVar16;
          local_c8 = (undefined1  [16])0x0;
          local_d8 = (undefined1  [16])0x0;
          local_e8 = (undefined1  [16])0x0;
          local_b8 = 0;
          Mat::create((Mat *)local_e8,uVar7,uVar16,local_68,opt->workspace_allocator);
          auVar31 = _DAT_001394c0;
          auVar3 = _DAT_001394b0;
          auVar30 = _DAT_00139440;
          iVar19 = -100;
          if (((void *)local_e8._0_8_ != (void *)0x0) &&
             ((long)(int)local_c8._12_4_ * local_b8 != 0)) {
            uVar8 = local_c8._12_4_ * (int)local_b8;
            if (0 < (int)uVar8) {
              lVar13 = (ulong)uVar8 - 1;
              auVar37._8_4_ = (int)lVar13;
              auVar37._0_8_ = lVar13;
              auVar37._12_4_ = (int)((ulong)lVar13 >> 0x20);
              uVar11 = 0;
              auVar37 = auVar37 ^ _DAT_00139440;
              do {
                auVar32._8_4_ = (int)uVar11;
                auVar32._0_8_ = uVar11;
                auVar32._12_4_ = (int)(uVar11 >> 0x20);
                auVar36 = (auVar32 | auVar31) ^ auVar30;
                iVar19 = auVar37._4_4_;
                if ((bool)(~(auVar36._4_4_ == iVar19 && auVar37._0_4_ < auVar36._0_4_ ||
                            iVar19 < auVar36._4_4_) & 1)) {
                  *(undefined4 *)(local_e8._0_8_ + uVar11 * 4) = 0xff7fffff;
                }
                if ((auVar36._12_4_ != auVar37._12_4_ || auVar36._8_4_ <= auVar37._8_4_) &&
                    auVar36._12_4_ <= auVar37._12_4_) {
                  *(undefined4 *)(local_e8._0_8_ + uVar11 * 4 + 4) = 0xff7fffff;
                }
                auVar36 = (auVar32 | auVar3) ^ auVar30;
                iVar22 = auVar36._4_4_;
                if (iVar22 <= iVar19 && (iVar22 != iVar19 || auVar36._0_4_ <= auVar37._0_4_)) {
                  *(undefined4 *)(local_e8._0_8_ + uVar11 * 4 + 8) = 0xff7fffff;
                  *(undefined4 *)(local_e8._0_8_ + uVar11 * 4 + 0xc) = 0xff7fffff;
                }
                uVar11 = uVar11 + 4;
              } while ((uVar8 + 3 & 0xfffffffc) != uVar11);
            }
            lVar13 = (long)(int)uVar7;
            if (0 < (int)uVar16) {
              pvVar18 = bottom_top_blob->data;
              sVar24 = bottom_top_blob->cstep;
              sVar1 = bottom_top_blob->elemsize;
              pvVar17 = (void *)0x0;
              pvVar21 = (void *)local_e8._0_8_;
              do {
                if (0 < iVar29) {
                  iVar19 = 0;
                  pvVar20 = pvVar18;
                  do {
                    if (0 < (int)uVar7) {
                      uVar11 = 0;
                      do {
                        fVar25 = *(float *)((long)pvVar20 + uVar11 * 4);
                        fVar26 = *(float *)((long)pvVar21 + uVar11 * 4);
                        if (fVar25 <= fVar26) {
                          fVar25 = fVar26;
                        }
                        *(float *)((long)pvVar21 + uVar11 * 4) = fVar25;
                        uVar11 = uVar11 + 1;
                      } while (uVar14 != uVar11);
                    }
                    iVar19 = iVar19 + 1;
                    pvVar20 = (void *)((long)pvVar20 + lVar13 * 4);
                  } while (iVar19 != iVar29);
                }
                pvVar17 = (void *)((long)pvVar17 + 1);
                pvVar18 = (void *)((long)pvVar18 + sVar24 * sVar1);
                pvVar21 = (void *)((long)pvVar21 + (long)(int)local_c8._4_4_ * 4);
              } while (pvVar17 != pvVar10);
            }
            if (0 < (int)uVar16) {
              local_70 = local_b0->data;
              local_48 = (long)(int)local_c8._4_4_ << 2;
              local_60 = (void *)(local_b0->cstep * local_b0->elemsize);
              pvVar21 = (void *)0x0;
              pvVar18 = (void *)local_e8._0_8_;
              local_50 = pvVar10;
              do {
                if (0 < iVar29) {
                  iVar19 = 0;
                  pvVar10 = local_70;
                  do {
                    if (0 < (int)uVar7) {
                      uVar11 = 0;
                      do {
                        fVar26 = expf(*(float *)((long)pvVar10 + uVar11 * 4) -
                                      *(float *)((long)pvVar18 + uVar11 * 4));
                        *(float *)((long)pvVar10 + uVar11 * 4) = fVar26;
                        uVar11 = uVar11 + 1;
                      } while (uVar14 != uVar11);
                    }
                    iVar19 = iVar19 + 1;
                    pvVar10 = (void *)((long)pvVar10 + lVar13 * 4);
                  } while (iVar19 != iVar29);
                }
                pvVar21 = (void *)((long)pvVar21 + 1);
                pvVar18 = (void *)((long)pvVar18 + local_48);
                local_70 = (void *)((long)local_70 + (long)local_60);
                pvVar10 = local_50;
              } while (pvVar21 != local_50);
            }
            local_88 = (undefined1  [16])0x0;
            local_98 = (undefined1  [16])0x0;
            _local_a8 = (undefined1  [16])0x0;
            local_78 = 0;
            iVar22 = (int)pvVar10;
            Mat::create((Mat *)local_a8,uVar7,iVar22,local_68,local_58->workspace_allocator);
            pMVar6 = local_b0;
            iVar19 = -100;
            if ((local_a8 != (undefined1  [8])0x0) && ((long)(int)local_88._12_4_ * local_78 != 0))
            {
              if (0 < local_88._12_4_ * (int)local_78) {
                memset((void *)local_a8,0,(ulong)(uint)(local_88._12_4_ * (int)local_78) << 2);
              }
              if (0 < iVar22) {
                pvVar18 = pMVar6->data;
                sVar24 = pMVar6->cstep;
                sVar1 = pMVar6->elemsize;
                pvVar21 = (void *)0x0;
                auVar12 = local_a8;
                do {
                  if (0 < iVar29) {
                    iVar19 = 0;
                    pvVar17 = pvVar18;
                    do {
                      if (0 < (int)uVar7) {
                        uVar11 = 0;
                        do {
                          *(float *)((long)auVar12 + uVar11 * 4) =
                               *(float *)((long)auVar12 + uVar11 * 4) +
                               *(float *)((long)pvVar17 + uVar11 * 4);
                          uVar11 = uVar11 + 1;
                        } while (uVar14 != uVar11);
                      }
                      iVar19 = iVar19 + 1;
                      pvVar17 = (void *)((long)pvVar17 + lVar13 * 4);
                    } while (iVar19 != iVar29);
                  }
                  pvVar21 = (void *)((long)pvVar21 + 1);
                  auVar12 = (undefined1  [8])((long)auVar12 + (long)(int)local_88._4_4_ * 4);
                  pvVar18 = (void *)((long)pvVar18 + sVar24 * sVar1);
                } while (pvVar21 != pvVar10);
              }
              if (0 < iVar22) {
                pvVar18 = pMVar6->data;
                sVar24 = pMVar6->cstep;
                sVar1 = pMVar6->elemsize;
                pvVar21 = (void *)0x0;
                auVar12 = local_a8;
                do {
                  if (0 < iVar29) {
                    iVar19 = 0;
                    pvVar17 = pvVar18;
                    do {
                      if (0 < (int)uVar7) {
                        uVar11 = 0;
                        do {
                          *(float *)((long)pvVar17 + uVar11 * 4) =
                               *(float *)((long)pvVar17 + uVar11 * 4) /
                               *(float *)((long)auVar12 + uVar11 * 4);
                          uVar11 = uVar11 + 1;
                        } while (uVar14 != uVar11);
                      }
                      iVar19 = iVar19 + 1;
                      pvVar17 = (void *)((long)pvVar17 + lVar13 * 4);
                    } while (iVar19 != iVar29);
                  }
                  pvVar21 = (void *)((long)pvVar21 + 1);
                  pvVar18 = (void *)((long)pvVar18 + sVar24 * sVar1);
                  auVar12 = (undefined1  [8])((long)auVar12 + (long)(int)local_88._4_4_ * 4);
                } while (pvVar21 != pvVar10);
              }
              iVar19 = 0;
            }
            Mat::~Mat((Mat *)local_a8);
          }
          Mat::~Mat((Mat *)local_e8);
          return iVar19;
        }
        goto LAB_0011d45a;
      }
      local_c8._4_4_ = bottom_top_blob->w;
      iVar29 = bottom_top_blob->h;
      uVar7 = bottom_top_blob->c;
      uVar11 = (ulong)uVar7;
      uVar16 = iVar29 * local_c8._4_4_;
      uVar14 = (ulong)uVar16;
      local_d8._8_8_ = opt->workspace_allocator;
      local_e8 = (undefined1  [16])0x0;
      local_d8._0_8_ = local_68;
      local_c8._0_4_ = 2;
      local_c8._8_4_ = iVar29;
      local_c8._12_4_ = 1;
      local_b8 = (size_t)(int)uVar16;
      iVar19 = local_c8._4_4_;
      if (uVar16 != 0) {
        local_70 = (void *)CONCAT44(local_70._4_4_,local_c8._4_4_);
        uVar23 = local_b8 * local_68 + 3 & 0xfffffffffffffffc;
        if ((Allocator *)local_d8._8_8_ == (Allocator *)0x0) {
          pvVar10 = malloc(uVar23 + 0x1c);
          local_e8._0_8_ = (long)pvVar10 + 0x17U & 0xfffffffffffffff0;
          *(void **)(local_e8._0_8_ - 8) = pvVar10;
        }
        else {
          local_e8._0_8_ = (*(code *)**(undefined8 **)local_d8._8_8_)();
        }
        local_e8._8_8_ = local_e8._0_8_ + uVar23;
        *(undefined4 *)(local_e8._0_8_ + uVar23) = 1;
        iVar19 = (int)local_70;
      }
      auVar31 = _DAT_001394c0;
      auVar3 = _DAT_001394b0;
      auVar30 = _DAT_00139440;
      uVar5 = local_e8._0_8_;
      iVar22 = -100;
      if (((void *)local_e8._0_8_ != (void *)0x0) && ((long)(int)local_c8._12_4_ * local_b8 != 0)) {
        local_70 = (void *)CONCAT44(local_70._4_4_,iVar19);
        uVar8 = local_c8._12_4_ * (int)local_b8;
        if (0 < (int)uVar8) {
          lVar13 = (ulong)uVar8 - 1;
          auVar28._8_4_ = (int)lVar13;
          auVar28._0_8_ = lVar13;
          auVar28._12_4_ = (int)((ulong)lVar13 >> 0x20);
          uVar23 = 0;
          auVar28 = auVar28 ^ _DAT_00139440;
          do {
            auVar34._8_4_ = (int)uVar23;
            auVar34._0_8_ = uVar23;
            auVar34._12_4_ = (int)(uVar23 >> 0x20);
            auVar36 = (auVar34 | auVar31) ^ auVar30;
            iVar19 = auVar28._4_4_;
            if ((bool)(~(auVar36._4_4_ == iVar19 && auVar28._0_4_ < auVar36._0_4_ ||
                        iVar19 < auVar36._4_4_) & 1)) {
              *(undefined4 *)(local_e8._0_8_ + uVar23 * 4) = 0xff7fffff;
            }
            if ((auVar36._12_4_ != auVar28._12_4_ || auVar36._8_4_ <= auVar28._8_4_) &&
                auVar36._12_4_ <= auVar28._12_4_) {
              *(undefined4 *)(local_e8._0_8_ + uVar23 * 4 + 4) = 0xff7fffff;
            }
            auVar36 = (auVar34 | auVar3) ^ auVar30;
            iVar22 = auVar36._4_4_;
            if (iVar22 <= iVar19 && (iVar22 != iVar19 || auVar36._0_4_ <= auVar28._0_4_)) {
              *(undefined4 *)(local_e8._0_8_ + uVar23 * 4 + 8) = 0xff7fffff;
              *(undefined4 *)(local_e8._0_8_ + uVar23 * 4 + 0xc) = 0xff7fffff;
            }
            uVar23 = uVar23 + 4;
          } while ((uVar8 + 3 & 0xfffffffc) != uVar23);
        }
        if (0 < (int)uVar7) {
          pvVar10 = bottom_top_blob->data;
          sVar24 = bottom_top_blob->cstep;
          sVar1 = bottom_top_blob->elemsize;
          uVar23 = 0;
          do {
            if (0 < (int)uVar16) {
              uVar15 = 0;
              do {
                fVar25 = *(float *)((long)pvVar10 + uVar15 * 4);
                fVar26 = *(float *)(local_e8._0_8_ + uVar15 * 4);
                if (fVar25 <= fVar26) {
                  fVar25 = fVar26;
                }
                *(float *)(local_e8._0_8_ + uVar15 * 4) = fVar25;
                uVar15 = uVar15 + 1;
              } while (uVar14 != uVar15);
            }
            uVar23 = uVar23 + 1;
            pvVar10 = (void *)((long)pvVar10 + sVar24 * sVar1);
          } while (uVar23 != uVar11);
        }
        if (0 < (int)uVar7) {
          pvVar10 = local_b0->data;
          sVar24 = local_b0->cstep;
          sVar1 = local_b0->elemsize;
          uVar23 = 0;
          do {
            if (0 < (int)uVar16) {
              uVar15 = 0;
              do {
                fVar26 = expf(*(float *)((long)pvVar10 + uVar15 * 4) -
                              *(float *)(uVar5 + uVar15 * 4));
                *(float *)((long)pvVar10 + uVar15 * 4) = fVar26;
                uVar15 = uVar15 + 1;
              } while (uVar14 != uVar15);
            }
            uVar23 = uVar23 + 1;
            pvVar10 = (void *)((long)pvVar10 + sVar24 * sVar1);
          } while (uVar23 != uVar11);
        }
        local_98._8_8_ = local_58->workspace_allocator;
        _local_a8 = (undefined1  [16])0x0;
        local_98._0_8_ = local_68;
        local_88._4_4_ = (int)local_70;
        local_88._0_4_ = 2;
        local_88._8_4_ = iVar29;
        local_88._12_4_ = 1;
        local_78 = (size_t)(int)uVar16;
        if (uVar16 != 0) {
          uVar23 = local_68 * local_78 + 3 & 0xfffffffffffffffc;
          if ((Allocator *)local_98._8_8_ == (Allocator *)0x0) {
            pvVar10 = malloc(uVar23 + 0x1c);
            local_a8 = (undefined1  [8])((long)pvVar10 + 0x17U & 0xfffffffffffffff0);
            *(void **)((long)local_a8 - 8) = pvVar10;
          }
          else {
            local_a8 = (undefined1  [8])(*(code *)**(undefined8 **)local_98._8_8_)(local_98._8_8_);
          }
          piStack_a0 = (int *)((long)local_a8 + uVar23);
          *(undefined4 *)((long)local_a8 + uVar23) = 1;
        }
        pMVar6 = local_b0;
        iVar22 = -100;
        if ((local_a8 != (undefined1  [8])0x0) && ((long)(int)local_88._12_4_ * local_78 != 0)) {
          if (0 < local_88._12_4_ * (int)local_78) {
            memset((void *)local_a8,0,(ulong)(uint)(local_88._12_4_ * (int)local_78) << 2);
          }
          if (0 < (int)uVar7) {
            pvVar10 = pMVar6->data;
            sVar24 = pMVar6->cstep;
            sVar1 = pMVar6->elemsize;
            uVar23 = 0;
            do {
              if (0 < (int)uVar16) {
                uVar15 = 0;
                do {
                  *(float *)((long)local_a8 + uVar15 * 4) =
                       *(float *)((long)local_a8 + uVar15 * 4) +
                       *(float *)((long)pvVar10 + uVar15 * 4);
                  uVar15 = uVar15 + 1;
                } while (uVar14 != uVar15);
              }
              uVar23 = uVar23 + 1;
              pvVar10 = (void *)((long)pvVar10 + sVar24 * sVar1);
            } while (uVar23 != uVar11);
          }
          if (0 < (int)uVar7) {
            pvVar10 = pMVar6->data;
            sVar24 = pMVar6->cstep;
            sVar1 = pMVar6->elemsize;
            uVar23 = 0;
            do {
              if (0 < (int)uVar16) {
                uVar15 = 0;
                do {
                  *(float *)((long)pvVar10 + uVar15 * 4) =
                       *(float *)((long)pvVar10 + uVar15 * 4) /
                       *(float *)((long)local_a8 + uVar15 * 4);
                  uVar15 = uVar15 + 1;
                } while (uVar14 != uVar15);
              }
              uVar23 = uVar23 + 1;
              pvVar10 = (void *)((long)pvVar10 + sVar24 * sVar1);
            } while (uVar23 != uVar11);
          }
          iVar22 = 0;
        }
        if (piStack_a0 != (int *)0x0) {
          LOCK();
          *piStack_a0 = *piStack_a0 + -1;
          UNLOCK();
          if (*piStack_a0 == 0) {
            if ((Allocator *)local_98._8_8_ == (Allocator *)0x0) {
              if (local_a8 != (undefined1  [8])0x0) {
                free(*(void **)((long)local_a8 + -8));
              }
            }
            else {
              (**(code **)(*(long *)local_98._8_8_ + 8))();
            }
          }
        }
        _local_a8 = (undefined1  [16])0x0;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = local_98._8_8_;
        local_98 = auVar4 << 0x40;
        local_78 = 0;
        local_88 = (undefined1  [16])0x0;
      }
      if ((int *)local_e8._8_8_ == (int *)0x0) {
        return iVar22;
      }
      LOCK();
      *(int *)local_e8._8_8_ = *(int *)local_e8._8_8_ + -1;
      UNLOCK();
      if (*(int *)local_e8._8_8_ != 0) {
        return iVar22;
      }
      if ((Allocator *)local_d8._8_8_ != (Allocator *)0x0) {
        (**(code **)(*(long *)local_d8._8_8_ + 8))();
        return iVar22;
      }
    }
    if ((void *)local_e8._0_8_ != (void *)0x0) {
      free(*(void **)(local_e8._0_8_ + -8));
    }
  }
  return iVar22;
}

Assistant:

int Softmax::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // value = exp( value - global max value )
    // sum all value
    // value = value / sum

    int dims = bottom_top_blob.dims;
    size_t elemsize = bottom_top_blob.elemsize;

    if (dims == 1) // axis == 0
    {
        int w = bottom_top_blob.w;

        float* ptr = bottom_top_blob;

        float max = -FLT_MAX;
        for (int i=0; i<w; i++)
        {
            max = std::max(max, ptr[i]);
        }

        for (int i=0; i<w; i++)
        {
            ptr[i] = exp(ptr[i] - max);
        }

        float sum = 0.f;
        for (int i=0; i<w; i++)
        {
            sum += ptr[i];
        }

        for (int i=0; i<w; i++)
        {
            ptr[i] /= sum;
        }

        return 0;
    }

    if (dims == 2 && axis == 0)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        Mat max;
        max.create(w, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);

        for (int i=0; i<h; i++)
        {
            const float* ptr = bottom_top_blob.row(i);
            for (int j=0; j<w; j++)
            {
                max[j] = std::max(max[j], ptr[j]);
            }
        }

        for (int i=0; i<h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            for (int j=0; j<w; j++)
            {
                ptr[j] = exp(ptr[j] - max[j]);
            }
        }

        Mat sum;
        sum.create(w, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);

        for (int i=0; i<h; i++)
        {
            const float* ptr = bottom_top_blob.row(i);
            for (int j=0; j<w; j++)
            {
                sum[j] += ptr[j];
            }
        }

        for (int i=0; i<h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            for (int j=0; j<w; j++)
            {
                ptr[j] /= sum[j];
            }
        }

        return 0;
    }

    if (dims == 2 && axis == 1)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        Mat max;
        max.create(h, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;

        for (int i=0; i<h; i++)
        {
            const float* ptr = bottom_top_blob.row(i);

            float m = -FLT_MAX;
            for (int j=0; j<w; j++)
            {
                m = std::max(m, ptr[j]);
            }

            max[i] = m;
        }

        for (int i=0; i<h; i++)
        {
            float* ptr = bottom_top_blob.row(i);

            float m = max[i];
            for (int j=0; j<w; j++)
            {
                ptr[j] = exp(ptr[j] - m);
            }
        }

        Mat sum;
        sum.create(h, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;

        for (int i=0; i<h; i++)
        {
            const float* ptr = bottom_top_blob.row(i);

            float s = 0.f;
            for (int j=0; j<w; j++)
            {
                s += ptr[j];
            }

            sum[i] = s;
        }

        for (int i=0; i<h; i++)
        {
            float* ptr = bottom_top_blob.row(i);

            float s = sum[i];
            for (int j=0; j<w; j++)
            {
                ptr[j] /= s;
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 0)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        Mat max;
        max.create(w, h, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                max[i] = std::max(max[i], ptr[i]);
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                ptr[i] = exp(ptr[i] - max[i]);
            }
        }

        Mat sum;
        sum.create(w, h, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                sum[i] += ptr[i];
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                ptr[i] /= sum[i];
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 1)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        Mat max;
        max.create(h, channels, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);

            for (int i=0; i<h; i++)
            {
                float max = -FLT_MAX;
                for (int j=0; j<w; j++)
                {
                    max = std::max(max, ptr[j]);
                }

                maxptr[i] = max;
                ptr += w;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);

            for (int i=0; i<h; i++)
            {
                float max = maxptr[i];
                for (int j=0; j<w; j++)
                {
                    ptr[j] = exp(ptr[j] - max);
                }

                ptr += w;
            }
        }

        Mat sum;
        sum.create(h, channels, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);
            float* sumptr = sum.row(q);

            for (int i=0; i<h; i++)
            {
                float sum = 0.f;
                for (int j=0; j<w; j++)
                {
                    sum += ptr[j];
                }

                sumptr[i] = sum;
                ptr += w;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* sumptr = sum.row(q);

            for (int i=0; i<h; i++)
            {
                float sum = sumptr[i];
                for (int j=0; j<w; j++)
                {
                    ptr[j] /= sum;
                }

                ptr += w;
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        Mat max;
        max.create(w, channels, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);

            for (int i=0; i<h; i++)
            {
                for (int j=0; j<w; j++)
                {
                    maxptr[j] = std::max(maxptr[j], ptr[j]);
                }

                ptr += w;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);

            for (int i=0; i<h; i++)
            {
                for (int j=0; j<w; j++)
                {
                    ptr[j] = exp(ptr[j] - maxptr[j]);
                }

                ptr += w;
            }
        }

        Mat sum;
        sum.create(w, channels, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);
            float* sumptr = sum.row(q);

            for (int i=0; i<h; i++)
            {
                for (int j=0; j<w; j++)
                {
                    sumptr[j] += ptr[j];
                }

                ptr += w;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* sumptr = sum.row(q);

            for (int i=0; i<h; i++)
            {
                for (int j=0; j<w; j++)
                {
                    ptr[j] /= sumptr[j];
                }

                ptr += w;
            }
        }

        return 0;
    }

    return 0;
}